

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O2

CURLcode tool_setopt_enum(CURL *curl,Configurable *config,char *name,CURLoption tag,
                         NameValue *nvlist,long lval)

{
  long *plVar1;
  char **ppcVar2;
  CURLcode CVar3;
  char *fmt;
  
  CVar3 = curl_easy_setopt(curl,tag,lval);
  if ((CVar3 == CURLE_OK && lval != 0) && config->libcurl != (char *)0x0) {
    do {
      ppcVar2 = &nvlist->name;
      if (*ppcVar2 == (char *)0x0) {
        fmt = "curl_easy_setopt(hnd, %s, %ldL);";
        goto LAB_00110c2c;
      }
      plVar1 = &nvlist->value;
      nvlist = nvlist + 1;
    } while (*plVar1 != lval);
    fmt = "curl_easy_setopt(hnd, %s, (long)%s);";
    lval = (long)*ppcVar2;
LAB_00110c2c:
    CVar3 = easysrc_addf(&easysrc_code,fmt,name,lval);
    if (CVar3 == CURLE_OK) {
      CVar3 = CURLE_OK;
    }
  }
  return CVar3;
}

Assistant:

CURLcode tool_setopt_enum(CURL *curl, struct Configurable *config,
                          const char *name, CURLoption tag,
                          const NameValue *nvlist, long lval)
{
  CURLcode ret = CURLE_OK;
  bool skip = FALSE;

  ret = curl_easy_setopt(curl, tag, lval);
  if(!lval)
    skip = TRUE;

  if(config->libcurl && !skip && !ret) {
    /* we only use this for real if --libcurl was used */
    const NameValue *nv = NULL;
    for(nv=nvlist; nv->name; nv++) {
      if(nv->value == lval) break; /* found it */
    }
    if(! nv->name) {
      /* If no definition was found, output an explicit value.
       * This could happen if new values are defined and used
       * but the NameValue list is not updated. */
      CODE2("curl_easy_setopt(hnd, %s, %ldL);", name, lval);
    }
    else {
      CODE2("curl_easy_setopt(hnd, %s, (long)%s);", name, nv->name);
    }
  }

 nomem:
  return ret;
}